

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O2

pboolean p_tree_remove(PTree *tree,pconstpointer key)

{
  pboolean pVar1;
  
  pVar1 = 0;
  if (((tree != (PTree *)0x0) && (tree->root != (PTreeBaseNode *)0x0)) &&
     (pVar1 = (*tree->remove_node_func)
                        (&tree->root,tree->compare_func,tree->data,tree->key_destroy_func,
                         tree->value_destroy_func,key), pVar1 == 1)) {
    tree->nnodes = tree->nnodes + -1;
    pVar1 = 1;
  }
  return pVar1;
}

Assistant:

P_LIB_API pboolean
p_tree_remove (PTree		*tree,
	       pconstpointer	key)
{
	pboolean result;

	if (P_UNLIKELY (tree == NULL || tree->root == NULL))
		return FALSE;

	result = tree->remove_node_func (&tree->root,
					 tree->compare_func,
					 tree->data,
					 tree->key_destroy_func,
					 tree->value_destroy_func,
					 key);
	if (result == TRUE)
		--tree->nnodes;

	return result;
}